

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::GenericPackage::GenericPackage(GenericPackage *this,Dictionary *d)

{
  Dictionary *d_local;
  GenericPackage *this_local;
  
  InterchangeObject::InterchangeObject(&this->super_InterchangeObject,d);
  (this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__GenericPackage_00339e30;
  UMID::UMID(&this->PackageUID);
  optional_property<ASDCP::MXF::UTF16String>::optional_property(&this->Name);
  Kumu::Timestamp::Timestamp(&this->PackageCreationDate);
  Kumu::Timestamp::Timestamp(&this->PackageModifiedDate);
  Array<Kumu::UUID>::Array(&this->Tracks);
  return;
}

Assistant:

GenericPackage::GenericPackage(const Dictionary* d) : InterchangeObject(d) {}